

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSPI.cpp
# Opt level: O2

void __thiscall wasm::JSPI::run(JSPI *this,Module *module)

{
  Expression *init;
  Export *pEVar1;
  tuple<wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_> tVar2;
  long lVar3;
  char *pcVar4;
  pointer puVar5;
  IString func_00;
  HeapType type;
  pointer puVar6;
  bool bVar7;
  RefNull *pRVar8;
  Function *pFVar9;
  iterator iVar10;
  string_view *psVar11;
  RefFunc *pRVar12;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *segment;
  __node_base_ptr p_Var13;
  uint uVar14;
  ulong uVar15;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  string_view *psVar16;
  __node_base_ptr p_Var17;
  pointer puVar18;
  Builder BVar19;
  string_view sVar20;
  Name name;
  Name name_00;
  Split local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  Split local_220;
  string local_200;
  IString local_1e0;
  undefined1 local_1d0 [8];
  string stateChangingImports;
  string stateChangingExports;
  Split listedExports;
  undefined1 local_160 [8];
  Split listedImports;
  HeapType local_130;
  Module *local_128;
  Builder local_120;
  Builder builder;
  vector<wasm::Function_*,_std::allocator<wasm::Function_*>_> originalFunctions;
  string local_f8;
  string local_d8;
  string_view local_b8;
  string local_a8;
  undefined1 auStack_88 [8];
  unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  wrappedExports;
  allocator<char> local_3d;
  uint local_3c;
  Module *local_38;
  
  local_120.wasm = module;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"jspi-imports",(allocator<char> *)local_160);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"",
             (allocator<char> *)(stateChangingImports.field_2._M_local_buf + 8));
  Pass::getArgumentOrDefault(&local_a8,&this->super_Pass,&local_d8,&local_f8);
  read_possible_response_file((string *)auStack_88,&local_a8);
  String::trim((string *)local_1d0,(string *)auStack_88);
  std::__cxx11::string::~string((string *)auStack_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_88,",",(allocator<char> *)&local_a8);
  String::Split::Split((Split *)local_160,(string *)local_1d0,(string *)auStack_88);
  std::__cxx11::string::~string((string *)auStack_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d8,"jspi-exports",
             (allocator<char> *)(stateChangingExports.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"",(allocator<char> *)&builder);
  Pass::getArgumentOrDefault(&local_a8,&this->super_Pass,&local_d8,&local_f8);
  read_possible_response_file((string *)auStack_88,&local_a8);
  String::trim((string *)((long)&stateChangingImports.field_2 + 8),(string *)auStack_88);
  std::__cxx11::string::~string((string *)auStack_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_88,",",(allocator<char> *)&local_a8);
  String::Split::Split
            ((Split *)((long)&stateChangingExports.field_2 + 8),
             (string *)((long)&stateChangingImports.field_2 + 8),(string *)auStack_88);
  std::__cxx11::string::~string((string *)auStack_88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_88,"jspi-split-module",(allocator<char> *)&local_a8);
  bVar7 = Pass::hasArgument(&this->super_Pass,(string *)auStack_88);
  std::__cxx11::string::~string((string *)auStack_88);
  type.id = DAT_01175b10.id;
  puVar18 = ModuleSplitting::LOAD_SECONDARY_MODULE;
  local_38 = module;
  if (bVar7) {
    HeapType::HeapType(&local_130,(Signature)ZEXT816(0));
    auStack_88 = (undefined1  [8])0x0;
    wrappedExports._M_h._M_buckets = (__buckets_ptr)0x0;
    wrappedExports._M_h._M_bucket_count = 0;
    name.super_IString.str._M_str = (char *)puVar18;
    name.super_IString.str._M_len = (size_t)&builder;
    Builder::makeFunction
              (name,type,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_130.id,
               (Expression *)auStack_88);
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)auStack_88);
    module = local_38;
    puVar18 = DAT_01174c48;
    ((builder.wasm)->functions).
    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = ENV;
    ((builder.wasm)->functions).
    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar18;
    puVar6 = (pointer)DAT_01175b10.id;
    ((builder.wasm)->functions).
    super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = ModuleSplitting::LOAD_SECONDARY_MODULE;
    ((builder.wasm)->globals).
    super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = puVar6;
    Module::addFunction(local_38,(unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *
                                 )&builder);
    IString::toString_abi_cxx11_(&local_d8,(IString *)&ENV);
    std::operator+(&local_a8,&local_d8,".");
    IString::toString_abi_cxx11_(&local_f8,(IString *)&ModuleSplitting::LOAD_SECONDARY_MODULE);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_88,
                   &local_a8,&local_f8);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_160,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_88);
    std::__cxx11::string::~string((string *)auStack_88);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
              ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&builder);
  }
  local_3c = CONCAT31(local_3c._1_3_,bVar7);
  Name::Name((Name *)&listedImports.needToHandleBracketingOperations,"suspender");
  local_b8 = (string_view)Names::getValidGlobalName(module,(Name)stack0xfffffffffffffec0);
  init = (Expression *)(this->externref).id;
  pRVar8 = Builder::makeRefNull(&local_120,(HeapType)0x60);
  name_00.super_IString.str._M_str = (char *)local_b8._M_len;
  name_00.super_IString.str._M_len = (size_t)auStack_88;
  Builder::makeGlobal(name_00,(Type)local_b8._M_str,init,(Mutability)pRVar8);
  Module::addGlobal(module,(unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
                           auStack_88);
  std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::~unique_ptr
            ((unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)auStack_88);
  auStack_88 = (undefined1  [8])&wrappedExports._M_h._M_rehash_policy._M_next_resize;
  wrappedExports._M_h._M_buckets = (__buckets_ptr)0x1;
  wrappedExports._M_h._M_bucket_count = 0;
  wrappedExports._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  wrappedExports._M_h._M_element_count._0_4_ = 0x3f800000;
  wrappedExports._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  wrappedExports._M_h._M_rehash_policy._4_4_ = 0;
  wrappedExports._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var17 = (__node_base_ptr)
            (module->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  wrappedExports._M_h._M_single_bucket = p_Var17;
  for (p_Var13 = (__node_base_ptr)
                 (module->exports).
                 super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; p_Var13 != p_Var17;
      p_Var13 = p_Var13 + 1) {
    pEVar1 = (((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true> *)
              &p_Var13->_M_nxt)->
             super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)._M_t.
             super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
             super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
    if (pEVar1->kind == Function) {
      IString::toString_abi_cxx11_(&local_200,(IString *)pEVar1);
      String::Split::Split(&local_260,(Split *)((long)&stateChangingExports.field_2 + 8));
      bVar7 = canChangeState(&local_200,&local_260);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_260.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
      std::__cxx11::string::~string((string *)&local_200);
      if (bVar7) {
        pEVar1 = (((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true> *)
                  &p_Var13->_M_nxt)->
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        if (*(__index_type *)
             ((long)&(pEVar1->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) == '\0'
           ) {
          psVar16 = (string_view *)&pEVar1->value;
        }
        else {
          psVar16 = (string_view *)0x0;
        }
        pFVar9 = Module::getFunction(local_38,(Name)*psVar16);
        iVar10 = std::
                 _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)auStack_88,(key_type *)pFVar9);
        if (iVar10.super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true>._M_cur
            == (__node_type *)0x0) {
          sVar20 = (string_view)makeWrapperForExport(this,pFVar9,local_38,(Name)local_b8);
          psVar11 = (string_view *)
                    std::__detail::
                    _Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)auStack_88,(key_type *)pFVar9);
          *psVar11 = sVar20;
        }
        else {
          sVar20 = *(string_view *)
                    ((long)iVar10.
                           super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true>.
                           _M_cur + 0x18);
        }
        *psVar16 = sVar20;
        p_Var17 = wrappedExports._M_h._M_single_bucket;
      }
    }
  }
  wrappedExports._M_h._M_single_bucket =
       (__node_base_ptr)
       (local_38->elementSegments).
       super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  for (p_Var13 = (__node_base_ptr)
                 (local_38->elementSegments).
                 super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      p_Var13 != wrappedExports._M_h._M_single_bucket; p_Var13 = p_Var13 + 1) {
    bVar7 = wasm::Type::isFunction
                      ((Type *)((long)(((__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
                                         *)&p_Var13->_M_nxt)->
                                      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                      )._M_t.
                                      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                               + 0x30));
    if (bVar7) {
      uVar14 = 0;
      while( true ) {
        uVar15 = (ulong)uVar14;
        tVar2.
        super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
        super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
             (((__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
                *)&p_Var13->_M_nxt)->
             super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
             )._M_t.
             super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
        ;
        lVar3 = *(long *)((long)tVar2.
                                super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl +
                         0x38);
        if ((ulong)(*(long *)((long)tVar2.
                                    super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                    .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                    _M_head_impl + 0x40) - lVar3 >> 3) <= uVar15) break;
        pcVar4 = *(char **)(lVar3 + uVar15 * 8);
        if (*pcVar4 == '+') {
          iVar10 = std::
                   _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)auStack_88,(key_type *)(pcVar4 + 0x10));
          if (iVar10.super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true>._M_cur
              != (__node_type *)0x0) {
            func_00.str = *(string_view *)
                           ((long)iVar10.
                                  super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true>
                                  ._M_cur + 0x18);
            pFVar9 = Module::getFunction(local_38,(Name)*(string_view *)
                                                         ((long)iVar10.
                                                  super__Node_iterator_base<std::pair<const_wasm::Name,_wasm::Name>,_true>
                                                  ._M_cur + 0x18));
            pRVar12 = Builder::makeRefFunc(&local_120,(Name)func_00.str,(HeapType)(pFVar9->type).id)
            ;
            *(RefFunc **)
             (*(long *)((long)(((__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
                                 *)&p_Var13->_M_nxt)->
                              super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                              )._M_t.
                              super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                       + 0x38) + uVar15 * 8) = pRVar12;
          }
        }
        uVar14 = uVar14 + 1;
      }
    }
  }
  builder.wasm = (Module *)0x0;
  puVar5 = (local_38->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar18 = (local_38->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar18 != puVar5; puVar18 = puVar18 + 1
      ) {
    local_a8._M_dataplus._M_p =
         (pointer)(puVar18->_M_t).
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    std::vector<wasm::Function*,std::allocator<wasm::Function*>>::emplace_back<wasm::Function*>
              ((vector<wasm::Function*,std::allocator<wasm::Function*>> *)&builder,
               (Function **)&local_a8);
  }
  local_128 = (Module *)0x0;
  local_3c = local_3c & 0xff;
  for (BVar19.wasm = builder.wasm; BVar19.wasm != local_128;
      BVar19.wasm = (Module *)
                    &((BVar19.wasm)->exports).
                     super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) {
    p_Var13 = (__node_base_ptr)
              ((BVar19.wasm)->exports).
              super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((_Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>)
        (((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true> *)
         &p_Var13[4]._M_nxt)->
        super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)._M_t !=
        (_Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>)0x0) {
      listedExports._24_8_ =
           (((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true> *)
            &p_Var13[3]._M_nxt)->
           super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)._M_t;
      local_1e0.str._M_len =
           *(size_t *)
            &(((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true> *)
              &p_Var13[5]._M_nxt)->
             super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)._M_t;
      local_1e0.str._M_str =
           *(char **)&(((__uniq_ptr_data<wasm::Export,_std::default_delete<wasm::Export>,_true,_true>
                         *)&p_Var13[6]._M_nxt)->
                      super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>)._M_t;
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_d8,
                 (basic_string_view<char,_std::char_traits<char>_> *)
                 &listedExports.needToHandleBracketingOperations,&local_3d);
      wrappedExports._M_h._M_single_bucket = p_Var13;
      std::operator+(&local_a8,&local_d8,'.');
      IString::toString_abi_cxx11_(&local_f8,&local_1e0);
      std::operator+(&local_240,&local_a8,&local_f8);
      std::__cxx11::string::~string((string *)&local_f8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_d8);
      String::Split::Split(&local_220,(Split *)local_160);
      bVar7 = canChangeState(&local_240,&local_220);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_220.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
      std::__cxx11::string::~string((string *)&local_240);
      if (bVar7) {
        makeWrapperForImport
                  (this,(Function *)wrappedExports._M_h._M_single_bucket,local_38,(Name)local_b8,
                   SUB41(local_3c,0));
      }
    }
  }
  std::_Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>::~_Vector_base
            ((_Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_> *)&builder);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)auStack_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&stateChangingExports.field_2 + 8));
  std::__cxx11::string::~string((string *)(stateChangingImports.field_2._M_local_buf + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_160);
  std::__cxx11::string::~string((string *)local_1d0);
  return;
}

Assistant:

void run(Module* module) override {
    Builder builder(*module);

    // Find which imports can suspend.
    auto stateChangingImports = String::trim(
      read_possible_response_file(getArgumentOrDefault("jspi-imports", "")));
    String::Split listedImports(stateChangingImports, ",");

    // Find which exports should create a promise.
    auto stateChangingExports = String::trim(
      read_possible_response_file(getArgumentOrDefault("jspi-exports", "")));
    String::Split listedExports(stateChangingExports, ",");

    bool wasmSplit = hasArgument("jspi-split-module");
    if (wasmSplit) {
      // Make an import for the load secondary module function so a JSPI wrapper
      // version will be created.
      auto import =
        Builder::makeFunction(ModuleSplitting::LOAD_SECONDARY_MODULE,
                              Signature(Type::none, Type::none),
                              {});
      import->module = ENV;
      import->base = ModuleSplitting::LOAD_SECONDARY_MODULE;
      module->addFunction(std::move(import));
      listedImports.push_back(
        ENV.toString() + "." +
        ModuleSplitting::LOAD_SECONDARY_MODULE.toString());
    }

    // Create a global to store the suspender that is passed into exported
    // functions and will then need to be passed out to the imported functions.
    Name suspender = Names::getValidGlobalName(*module, "suspender");
    module->addGlobal(builder.makeGlobal(suspender,
                                         externref,
                                         builder.makeRefNull(HeapType::noext),
                                         Builder::Mutable));

    // Keep track of already wrapped functions since they can be exported
    // multiple times, but only one wrapper is needed.
    std::unordered_map<Name, Name> wrappedExports;

    // Wrap each exported function in a function that stores the suspender
    // and calls the original export.
    for (auto& ex : module->exports) {
      if (ex->kind == ExternalKind::Function &&
          canChangeState(ex->name.toString(), listedExports)) {
        auto* name = ex->getInternalName();
        auto* func = module->getFunction(*name);
        Name wrapperName;
        auto iter = wrappedExports.find(func->name);
        if (iter == wrappedExports.end()) {
          wrapperName = makeWrapperForExport(func, module, suspender);
          wrappedExports[func->name] = wrapperName;
        } else {
          wrapperName = iter->second;
        }
        *name = wrapperName;
      }
    }

    // Replace any references to the original exports that are in the elements.
    for (auto& segment : module->elementSegments) {
      if (!segment->type.isFunction()) {
        continue;
      }
      for (Index i = 0; i < segment->data.size(); i++) {
        if (auto* get = segment->data[i]->dynCast<RefFunc>()) {
          auto iter = wrappedExports.find(get->func);
          if (iter == wrappedExports.end()) {
            continue;
          }
          auto* replacementRef = builder.makeRefFunc(
            iter->second, module->getFunction(iter->second)->type);
          segment->data[i] = replacementRef;
        }
      }
    }

    // Avoid iterator invalidation later.
    std::vector<Function*> originalFunctions;
    for (auto& func : module->functions) {
      originalFunctions.push_back(func.get());
    }
    // Wrap each imported function in a function that gets the global suspender
    // and passes it on to the imported function.
    for (auto* im : originalFunctions) {
      if (im->imported() &&
          canChangeState(getFullFunctionName(im->module, im->base),
                         listedImports)) {
        makeWrapperForImport(im, module, suspender, wasmSplit);
      }
    }
  }